

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

bool __thiscall QPDFObjectHandle::isMatrix(QPDFObjectHandle *this)

{
  bool bVar1;
  int i;
  int iVar2;
  byte unaff_BPL;
  Array array;
  QPDFObjectHandle local_78;
  element_type *local_68;
  Array local_60;
  pair<bool,_QPDFObjectHandle> local_48;
  
  iVar2 = 0;
  as_array(&local_60,this,strict);
  local_68 = local_60.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    do {
      if (iVar2 == 6) {
        iVar2 = ::qpdf::Array::size(&local_60);
        unaff_BPL = iVar2 == 6;
        goto LAB_001c0991;
      }
      ::qpdf::Array::at(&local_48,&local_60,iVar2);
      local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_48.second.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_48.second.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_48.second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      local_48.second.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_48.second.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      bVar1 = isNumber(&local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_78.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      iVar2 = iVar2 + 1;
    } while (bVar1);
    unaff_BPL = 0;
  }
LAB_001c0991:
  bVar1 = local_68 != (element_type *)0x0;
  ::qpdf::Array::~Array(&local_60);
  return (bool)(bVar1 & unaff_BPL);
}

Assistant:

bool
QPDFObjectHandle::isMatrix() const
{
    if (auto array = as_array(strict)) {
        for (int i = 0; i < 6; ++i) {
            if (auto item = array.at(i).second; !item.isNumber()) {
                return false;
            }
        }
        return array.size() == 6;
    }
    return false;
}